

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

bool __thiscall testing::internal::MatchMatrix::NextGraph(MatchMatrix *this)

{
  ulong uVar1;
  size_t ilhs;
  size_t irhs;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  
  for (ilhs = 0; uVar1 = *(ulong *)this, ilhs < uVar1; ilhs = ilhs + 1) {
    uVar2 = 0;
    while (uVar2 < *(ulong *)(this + 8)) {
      lVar3 = *(ulong *)(this + 8) * ilhs + *(long *)(this + 0x10);
      bVar4 = *(char *)(uVar2 + lVar3) == '\0';
      *(bool *)(uVar2 + lVar3) = bVar4;
      uVar2 = uVar2 + 1;
      if (bVar4) goto LAB_0017bb76;
    }
  }
LAB_0017bb76:
  return ilhs < uVar1;
}

Assistant:

bool MatchMatrix::NextGraph() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      if (!b) {
        b = 1;
        return true;
      }
      b = 0;
    }
  }
  return false;
}